

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O3

size_t u64CLZ(u64 w)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = w >> 1 | w;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 0x10 | uVar1;
  uVar1 = ~(uVar1 >> 0x20 | uVar1);
  uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
  uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  uVar1 = (uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f;
  uVar1 = (uVar1 >> 8) + uVar1;
  lVar2 = (uVar1 >> 0x10) + uVar1;
  return (ulong)((int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0x7f);
}

Assistant:

size_t SAFE(u64CLZ)(register u64 w)
{
	w = w | w >> 1;
	w = w | w >> 2;
	w = w | w >> 4;
	w = w | w >> 8;
	w = w | w >> 16;
	w = w | w >> 32;
	return u64Weight(~w);
}